

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  uint local_c;
  
  RVar1 = Load<unsigned_int>(this,instr,&local_c,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    value.v[2] = local_c;
    value.v[3] = local_c;
    value.v[0] = local_c;
    value.v[1] = local_c;
    Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}